

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

TPM_RC TPM2_SequenceComplete
                 (TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT sequenceHandle,
                 TPM2B_MAX_BUFFER *buffer,TPMI_RH_HIERARCHY hierarchy,TPM2B_DIGEST *result,
                 TPMT_TK_HASHCHECK *validation)

{
  ushort uVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  TPM_RC TVar4;
  INT32 sizeParamBuf;
  BYTE *paramBuf;
  TPMI_RH_HIERARCHY hierarchy_local;
  TPMI_DH_OBJECT sequenceHandle_local;
  TSS_SESSION *session_local;
  TPMT_TK_HASHCHECK local_308c;
  TSS_CMD_CONTEXT CmdCtx;
  
  sizeParamBuf = 0x1000;
  paramBuf = CmdCtx.ParamBuffer;
  CmdCtx.ParamSize = 0;
  hierarchy_local = hierarchy;
  sequenceHandle_local = sequenceHandle;
  session_local = session;
  if (buffer == (TPM2B_MAX_BUFFER *)0x0) {
    uVar1 = UINT16_Marshal(&NullSize,&paramBuf,&sizeParamBuf);
  }
  else {
    uVar1 = TPM2B_MAX_BUFFER_Marshal(buffer,&paramBuf,&sizeParamBuf);
  }
  CmdCtx.ParamSize = uVar1 + CmdCtx.ParamSize;
  UVar2 = UINT32_Marshal(&hierarchy_local,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar2;
  TVar3 = TSS_DispatchCmd(tpm,0x13e,&sequenceHandle_local,1,&session_local,1,&CmdCtx);
  if (TVar3 == 0) {
    TVar4 = TPM2B_DIGEST_Unmarshal(result,&CmdCtx.RespBufPtr,(INT32 *)&CmdCtx.RespBytesLeft);
    TVar3 = 0x9a;
    if (TVar4 == 0) {
      if (validation == (TPMT_TK_HASHCHECK *)0x0) {
        validation = &local_308c;
      }
      TVar4 = TPMT_TK_HASHCHECK_Unmarshal
                        (validation,&CmdCtx.RespBufPtr,(INT32 *)&CmdCtx.RespBytesLeft);
      if (TVar4 == 0) {
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2_SequenceComplete(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          sequenceHandle,     // IN
    TPM2B_MAX_BUFFER       *buffer,             // IN
    TPMI_RH_HIERARCHY       hierarchy,          // IN [opt]
    TPM2B_DIGEST           *result,             // OUT
    TPMT_TK_HASHCHECK      *validation          // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, buffer);
    TSS_MARSHAL(TPMI_RH_HIERARCHY, &hierarchy);
    DISPATCH_CMD(SequenceComplete, &sequenceHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_DIGEST, result);
    TSS_UNMARSHAL_OPT(TPMT_TK_HASHCHECK, validation);
    END_CMD();
}